

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

MRIStepCoupling MRIStepCoupling_LoadTableByName(char *method)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  char *in_RDI;
  sunrealtype g10;
  sunrealtype g9;
  sunrealtype g8;
  sunrealtype g7;
  sunrealtype g6;
  sunrealtype g5;
  sunrealtype b10;
  sunrealtype b9;
  sunrealtype b8;
  sunrealtype b7;
  sunrealtype b6;
  sunrealtype b5;
  sunrealtype b4;
  sunrealtype b3;
  sunrealtype a10;
  sunrealtype a9;
  sunrealtype a8;
  sunrealtype a7;
  sunrealtype a6;
  sunrealtype a5;
  sunrealtype a4;
  sunrealtype a3;
  sunrealtype a2;
  sunrealtype c10;
  sunrealtype c9;
  sunrealtype c8;
  sunrealtype c7;
  sunrealtype c6_1;
  sunrealtype c5_1;
  sunrealtype c4_1;
  sunrealtype c3_1;
  sunrealtype c2_3;
  MRIStepCoupling C_25;
  sunrealtype c6;
  sunrealtype c5;
  sunrealtype c4;
  sunrealtype c3;
  sunrealtype c2_2;
  MRIStepCoupling C_24;
  sunrealtype c2_1;
  MRIStepCoupling C_23;
  sunrealtype c2;
  MRIStepCoupling C_22;
  MRIStepCoupling C_21;
  MRIStepCoupling C_20;
  MRIStepCoupling C_19;
  MRIStepCoupling C_18;
  sunrealtype beta_2;
  MRIStepCoupling C_17;
  sunrealtype beta_1;
  MRIStepCoupling C_16;
  MRIStepCoupling C_15;
  MRIStepCoupling C_14;
  MRIStepCoupling C_13;
  MRIStepCoupling C_12;
  sunrealtype beta;
  MRIStepCoupling C_11;
  MRIStepCoupling C_10;
  ARKodeButcherTable B_5;
  MRIStepCoupling C_9;
  MRIStepCoupling C_8;
  MRIStepCoupling C_7;
  MRIStepCoupling C_6;
  MRIStepCoupling C_5;
  MRIStepCoupling C_4;
  ARKodeButcherTable B_4;
  MRIStepCoupling C_3;
  ARKodeButcherTable B_3;
  MRIStepCoupling C_2;
  ARKodeButcherTable B_2;
  MRIStepCoupling C_1;
  ARKodeButcherTable B_1;
  MRIStepCoupling C;
  ARKodeButcherTable B;
  ARKodeButcherTable in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  MRISTEP_METHOD_TYPE type;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdd0;
  ARKodeButcherTable in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffe98;
  ARKODE_ERKTableID emethod;
  MRIStepCoupling local_8;
  
  type = (MRISTEP_METHOD_TYPE)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  emethod = (ARKODE_ERKTableID)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  iVar1 = strcmp("ARKODE_MRI_NONE",in_RDI);
  if (iVar1 == 0) {
    local_8 = (MRIStepCoupling)0x0;
  }
  else {
    iVar1 = strcmp("ARKODE_MRI_GARK_FORWARD_EULER",in_RDI);
    if (iVar1 == 0) {
      ARKodeButcherTable_LoadERK(emethod);
      local_8 = MRIStepCoupling_MIStoMRI
                          (in_stack_fffffffffffffdd8,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20)
                           ,(int)in_stack_fffffffffffffdd0);
      ARKodeButcherTable_Free(in_stack_fffffffffffffda0);
    }
    else {
      iVar1 = strcmp("ARKODE_MRI_GARK_RALSTON2",in_RDI);
      if (iVar1 == 0) {
        ARKodeButcherTable_LoadERK(emethod);
        local_8 = MRIStepCoupling_MIStoMRI
                            (in_stack_fffffffffffffdd8,
                             (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                             (int)in_stack_fffffffffffffdd0);
        ARKodeButcherTable_Free(in_stack_fffffffffffffda0);
      }
      else {
        iVar1 = strcmp("ARKODE_MIS_KW3",in_RDI);
        if (iVar1 == 0) {
          ARKodeButcherTable_LoadERK(emethod);
          local_8 = MRIStepCoupling_MIStoMRI
                              (in_stack_fffffffffffffdd8,
                               (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                               (int)in_stack_fffffffffffffdd0);
          ARKodeButcherTable_Free(in_stack_fffffffffffffda0);
        }
        else {
          iVar1 = strcmp("ARKODE_MRI_GARK_ERK22a",in_RDI);
          if (iVar1 == 0) {
            ARKodeButcherTable_LoadERK(emethod);
            local_8 = MRIStepCoupling_MIStoMRI
                                (in_stack_fffffffffffffdd8,
                                 (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                                 (int)in_stack_fffffffffffffdd0);
            ARKodeButcherTable_Free(in_stack_fffffffffffffda0);
          }
          else {
            iVar1 = strcmp("ARKODE_MRI_GARK_ERK22b",in_RDI);
            if (iVar1 == 0) {
              ARKodeButcherTable_LoadERK(emethod);
              local_8 = MRIStepCoupling_MIStoMRI
                                  (in_stack_fffffffffffffdd8,
                                   (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                                   (int)in_stack_fffffffffffffdd0);
              ARKodeButcherTable_Free(in_stack_fffffffffffffda0);
            }
            else {
              iVar1 = strcmp("ARKODE_MRI_GARK_ERK33a",in_RDI);
              if (iVar1 == 0) {
                local_8 = MRIStepCoupling_Alloc
                                    ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                     (int)in_stack_fffffffffffffdb8,type);
                local_8->q = 3;
                local_8->p = 2;
                local_8->c[1] = 0.3333333333333333;
                local_8->c[2] = 0.6666666666666666;
                local_8->c[3] = 1.0;
                *(*local_8->W)[1] = 0.3333333333333333;
                *(*local_8->W)[2] = -0.3333333333333333;
                (*local_8->W)[2][1] = 0.6666666666666666;
                (*local_8->W)[3][1] = -0.6666666666666666;
                (*local_8->W)[3][2] = 1.0;
                *(*local_8->W)[4] = 0.08333333333333333;
                (*local_8->W)[4][1] = -0.3333333333333333;
                (*local_8->W)[4][2] = 0.5833333333333334;
                *local_8->W[1][3] = 0.5;
                local_8->W[1][3][2] = -0.5;
              }
              else {
                iVar1 = strcmp("ARKODE_MRI_GARK_RALSTON3",in_RDI);
                if (iVar1 == 0) {
                  local_8 = MRIStepCoupling_Alloc
                                      ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                       (int)in_stack_fffffffffffffdb8,type);
                  local_8->q = 3;
                  local_8->p = 2;
                  local_8->c[1] = 0.5;
                  local_8->c[2] = (sunrealtype)&DAT_3fe8000000000000;
                  local_8->c[3] = 1.0;
                  *(*local_8->W)[1] = 0.5;
                  *(*local_8->W)[2] = -2.75;
                  (*local_8->W)[2][1] = 3.0;
                  *(*local_8->W)[3] = 1.3055555555555556;
                  (*local_8->W)[3][1] = -0.16666666666666666;
                  (*local_8->W)[3][2] = -0.8888888888888888;
                  *(*local_8->W)[4] = 0.025;
                  (*local_8->W)[4][1] = 0.175;
                  (*local_8->W)[4][2] = 0.05;
                  *local_8->W[1][2] = 4.5;
                  local_8->W[1][2][1] = -4.5;
                  *local_8->W[1][3] = -2.1666666666666665;
                  local_8->W[1][3][1] = -0.5;
                  local_8->W[1][3][2] = 2.6666666666666665;
                }
                else {
                  iVar1 = strcmp("ARKODE_MRI_GARK_ERK45a",in_RDI);
                  if (iVar1 == 0) {
                    local_8 = MRIStepCoupling_Alloc
                                        ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                         (int)in_stack_fffffffffffffdb8,type);
                    local_8->q = 4;
                    local_8->p = 3;
                    local_8->c[1] = 0.2;
                    local_8->c[2] = 0.4;
                    local_8->c[3] = 0.6;
                    local_8->c[4] = 0.8;
                    local_8->c[5] = 1.0;
                    *(*local_8->W)[1] = 0.2;
                    *(*local_8->W)[2] = -3.3125;
                    (*local_8->W)[2][1] = 3.5125;
                    *(*local_8->W)[3] = -0.5121234603937985;
                    (*local_8->W)[3][1] = 1.9554969207875972;
                    (*local_8->W)[3][2] = -1.2433734603937985;
                    *(*local_8->W)[4] = -0.10689272115871615;
                    (*local_8->W)[4][1] = -4.6566930569811165;
                    (*local_8->W)[4][2] = 3.994968532757531;
                    (*local_8->W)[4][3] = 0.9686172453823019;
                    *(*local_8->W)[5] = 0.911960843690752;
                    (*local_8->W)[5][1] = -0.1837327083772207;
                    (*local_8->W)[5][2] = -1.1939268660908644;
                    (*local_8->W)[5][3] = -2.6119830068113195;
                    (*local_8->W)[5][4] = 3.2776817375886527;
                    *(*local_8->W)[6] = -1.8585843690752053;
                    (*local_8->W)[6][1] = 2.2246676060069692;
                    (*local_8->W)[6][2] = -0.5244469581796045;
                    (*local_8->W)[6][3] = -0.09396291472257937;
                    (*local_8->W)[6][4] = 0.45232663597042;
                    *local_8->W[1][2] = 6.2875;
                    local_8->W[1][2][1] = -6.2875;
                    *local_8->W[1][3] = -0.0382530792124029;
                    local_8->W[1][3][1] = 0.6952561584248058;
                    local_8->W[1][3][2] = -0.6570030792124029;
                    *local_8->W[1][4] = 1.87616694642529;
                    local_8->W[1][4][1] = 3.0037681973833417;
                    local_8->W[1][4][2] = -3.0;
                    local_8->W[1][4][3] = -1.8799351438086316;
                    *local_8->W[1][5] = -2.4238031914893616;
                    local_8->W[1][5][1] = 2.0;
                    local_8->W[1][5][2] = 1.0;
                    local_8->W[1][5][3] = 5.0;
                    local_8->W[1][5][4] = -5.576196808510638;
                    *local_8->W[1][6] = 3.304787234042553;
                    local_8->W[1][6][1] = -3.304787234042553;
                  }
                  else {
                    iVar1 = strcmp("ARKODE_MRI_GARK_BACKWARD_EULER",in_RDI);
                    if (iVar1 == 0) {
                      local_8 = MRIStepCoupling_Alloc
                                          ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                           (int)in_stack_fffffffffffffdb8,type);
                      local_8->q = 1;
                      local_8->p = 0;
                      local_8->c[1] = 1.0;
                      local_8->c[2] = 1.0;
                      *(*local_8->G)[1] = 1.0;
                      *(*local_8->G)[2] = -1.0;
                      (*local_8->G)[2][2] = 1.0;
                    }
                    else {
                      iVar1 = strcmp("ARKODE_MRI_GARK_IRK21a",in_RDI);
                      if (iVar1 == 0) {
                        pAVar2 = ARKodeButcherTable_Alloc
                                           ((int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                                            (int)in_stack_fffffffffffffda8);
                        pAVar2->q = 2;
                        pAVar2->p = 1;
                        pAVar2->c[1] = 1.0;
                        pAVar2->c[2] = 1.0;
                        *pAVar2->A[1] = 1.0;
                        *pAVar2->A[2] = 0.5;
                        pAVar2->A[2][2] = 0.5;
                        *pAVar2->b = 0.5;
                        pAVar2->b[2] = 0.5;
                        pAVar2->d[2] = 1.0;
                        local_8 = MRIStepCoupling_MIStoMRI
                                            (in_stack_fffffffffffffdd8,
                                             (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                                             (int)in_stack_fffffffffffffdd0);
                        ARKodeButcherTable_Free(in_stack_fffffffffffffda0);
                      }
                      else {
                        iVar1 = strcmp("ARKODE_MRI_GARK_IMPLICIT_MIDPOINT",in_RDI);
                        if (iVar1 == 0) {
                          local_8 = MRIStepCoupling_Alloc
                                              ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                               (int)in_stack_fffffffffffffdb8,type);
                          local_8->q = 2;
                          local_8->p = 0;
                          local_8->c[1] = 0.5;
                          local_8->c[2] = 0.5;
                          local_8->c[3] = 1.0;
                          *(*local_8->G)[1] = 0.5;
                          *(*local_8->G)[2] = -0.5;
                          (*local_8->G)[2][2] = 0.5;
                          (*local_8->G)[3][2] = 0.5;
                        }
                        else {
                          iVar1 = strcmp("ARKODE_MRI_GARK_ESDIRK34a",in_RDI);
                          if (iVar1 == 0) {
                            local_8 = MRIStepCoupling_Alloc
                                                ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                                 (int)in_stack_fffffffffffffdb8,type);
                            local_8->q = 3;
                            local_8->p = 2;
                            local_8->c[1] = 0.3333333333333333;
                            local_8->c[2] = 0.3333333333333333;
                            local_8->c[3] = 0.6666666666666666;
                            local_8->c[4] = 0.6666666666666666;
                            local_8->c[5] = 1.0;
                            local_8->c[6] = 1.0;
                            local_8->c[7] = 1.0;
                            *(*local_8->G)[1] = 0.3333333333333333;
                            *(*local_8->G)[2] = -0.435866521508459;
                            (*local_8->G)[2][2] = 0.435866521508459;
                            *(*local_8->G)[3] = -0.3045790611944505;
                            (*local_8->G)[3][2] = 0.6379123945277838;
                            *(*local_8->G)[4] = 0.21169131056402665;
                            (*local_8->G)[4][2] = -0.6475578320724856;
                            (*local_8->G)[4][4] = 0.435866521508459;
                            *(*local_8->G)[5] = 0.4454209388055495;
                            (*local_8->G)[5][2] = 0.8813784805616198;
                            (*local_8->G)[5][4] = -0.993466086033836;
                            *(*local_8->G)[6] = -0.435866521508459;
                            (*local_8->G)[6][6] = 0.435866521508459;
                            *(*local_8->G)[8] = 0.24538319991175245;
                            (*local_8->G)[8][2] = 0.4204215033044045;
                            (*local_8->G)[8][4] = -1.5769926063440662;
                            (*local_8->G)[8][6] = 0.9111879031279093;
                          }
                          else {
                            iVar1 = strcmp("ARKODE_MRI_GARK_ESDIRK46a",in_RDI);
                            if (iVar1 == 0) {
                              local_8 = MRIStepCoupling_Alloc
                                                  ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                                   (int)in_stack_fffffffffffffdb8,type);
                              local_8->q = 4;
                              local_8->p = 3;
                              local_8->c[1] = 0.2;
                              local_8->c[2] = 0.2;
                              local_8->c[3] = 0.4;
                              local_8->c[4] = 0.4;
                              local_8->c[5] = 0.6;
                              local_8->c[6] = 0.6;
                              local_8->c[7] = 0.8;
                              local_8->c[8] = 0.8;
                              local_8->c[9] = 1.0;
                              local_8->c[10] = 1.0;
                              local_8->c[0xb] = 1.0;
                              *(*local_8->G)[1] = 0.2;
                              *(*local_8->G)[2] = -0.25;
                              (*local_8->G)[2][2] = 0.25;
                              *(*local_8->G)[3] = 0.9179311933794375;
                              (*local_8->G)[3][2] = -0.7179311933794374;
                              *(*local_8->G)[4] = 2.6431723539618277;
                              (*local_8->G)[4][2] = -2.8931723539618277;
                              (*local_8->G)[4][4] = 0.25;
                              *(*local_8->G)[5] = 0.501564151341775;
                              (*local_8->G)[5][2] = 0.06834736723773695;
                              (*local_8->G)[5][4] = -0.369911518579512;
                              *(*local_8->G)[6] = 4.342116951031425;
                              (*local_8->G)[6][2] = 0.03897604588394062;
                              (*local_8->G)[6][4] = -4.631092996915365;
                              (*local_8->G)[6][6] = 0.25;
                              *(*local_8->G)[7] = -1.6900149539119083;
                              (*local_8->G)[7][2] = 0.7232372452056922;
                              (*local_8->G)[7][4] = 1.84784916447243;
                              (*local_8->G)[7][6] = -0.681071455766214;
                              *(*local_8->G)[8] = 3.3152679948497616;
                              (*local_8->G)[8][2] = 1.0862351276543005;
                              (*local_8->G)[8][4] = -1.2024240374287367;
                              (*local_8->G)[8][6] = -3.4490790850753257;
                              (*local_8->G)[8][8] = 0.25;
                              *(*local_8->G)[9] = -1.563558636602688;
                              (*local_8->G)[9][2] = 1.0208839548357729;
                              (*local_8->G)[9][4] = 2.4893844266591256;
                              (*local_8->G)[9][6] = -0.18652827667797553;
                              (*local_8->G)[9][8] = -1.5601814682142348;
                              *(*local_8->G)[10] = 0.19;
                              (*local_8->G)[10][2] = -0.24333333333333335;
                              (*local_8->G)[10][4] = 0.42333333333333334;
                              (*local_8->G)[10][6] = 0.42333333333333334;
                              (*local_8->G)[10][8] = -1.0433333333333332;
                              (*local_8->G)[10][10] = 0.25;
                              *(*local_8->G)[0xc] = -0.25;
                              (*local_8->G)[0xc][2] = 0.6355065879145843;
                              (*local_8->G)[0xc][4] = -0.27771467514766013;
                              (*local_8->G)[0xc][6] = -0.4798955020445252;
                              (*local_8->G)[0xc][8] = 0.5009086778736938;
                              (*local_8->G)[0xc][10] = -0.1288050885960927;
                              *local_8->G[1][3] = -1.735862386758875;
                              local_8->G[1][3][2] = 1.735862386758875;
                              *local_8->G[1][4] = -5.82844997108155;
                              local_8->G[1][4][2] = 5.82844997108155;
                              *local_8->G[1][5] = -0.4610230395256553;
                              local_8->G[1][5][2] = -0.9787999976333687;
                              local_8->G[1][5][4] = 1.439823037159024;
                              *local_8->G[1][6] = -7.403989721900906;
                              local_8->G[1][6][2] = 0.06115468960863698;
                              local_8->G[1][6][4] = 7.342835032292269;
                              *local_8->G[1][7] = 2.099785727661873;
                              local_8->G[1][7][2] = -1.5855812717879028;
                              local_8->G[1][7][4] = -2.9763473674063983;
                              local_8->G[1][7][6] = 2.462142911532428;
                              *local_8->G[1][8] = -5.523652150637583;
                              local_8->G[1][8][2] = -1.829811152193671;
                              local_8->G[1][8][4] = 1.8342166973064529;
                              local_8->G[1][8][6] = 5.519246605524801;
                              *local_8->G[1][9] = 2.0202334341434356;
                              local_8->G[1][9][2] = -2.384427012786476;
                              local_8->G[1][9][4] = -4.40813747576723;
                              local_8->G[1][9][6] = 0.15196811798180143;
                              local_8->G[1][9][8] = 4.62036293642847;
                              *local_8->G[1][10] = 0.12;
                              local_8->G[1][10][2] = -0.09666666666666666;
                              local_8->G[1][10][4] = 0.23666666666666666;
                              local_8->G[1][10][6] = 0.23666666666666666;
                              local_8->G[1][10][8] = -0.49666666666666665;
                            }
                            else {
                              iVar1 = strcmp("ARKODE_IMEX_MRI_GARK_EULER",in_RDI);
                              if (iVar1 == 0) {
                                local_8 = MRIStepCoupling_Alloc
                                                    ((int)((ulong)in_stack_fffffffffffffdb8 >> 0x20)
                                                     ,(int)in_stack_fffffffffffffdb8,type);
                                local_8->q = 1;
                                local_8->p = 0;
                                local_8->c[1] = 1.0;
                                local_8->c[2] = 1.0;
                                *(*local_8->W)[1] = 1.0;
                                *(*local_8->G)[1] = 1.0;
                                *(*local_8->G)[2] = -1.0;
                                (*local_8->G)[2][2] = 1.0;
                              }
                              else {
                                iVar1 = strcmp("ARKODE_IMEX_MRI_GARK_TRAPEZOIDAL",in_RDI);
                                if (iVar1 == 0) {
                                  local_8 = MRIStepCoupling_Alloc
                                                      ((int)((ulong)in_stack_fffffffffffffdb8 >>
                                                            0x20),(int)in_stack_fffffffffffffdb8,
                                                       type);
                                  local_8->q = 2;
                                  local_8->p = 0;
                                  local_8->c[1] = 1.0;
                                  local_8->c[2] = 1.0;
                                  local_8->c[3] = 1.0;
                                  *(*local_8->W)[1] = 1.0;
                                  *(*local_8->W)[3] = -0.5;
                                  (*local_8->W)[3][2] = 0.5;
                                  *(*local_8->G)[1] = 1.0;
                                  *(*local_8->G)[2] = -0.5;
                                  (*local_8->G)[2][2] = 0.5;
                                }
                                else {
                                  iVar1 = strcmp("ARKODE_IMEX_MRI_GARK_MIDPOINT",in_RDI);
                                  if (iVar1 == 0) {
                                    local_8 = MRIStepCoupling_Alloc
                                                        ((int)((ulong)in_stack_fffffffffffffdb8 >>
                                                              0x20),(int)in_stack_fffffffffffffdb8,
                                                         type);
                                    local_8->q = 2;
                                    local_8->p = 0;
                                    local_8->c[1] = 0.5;
                                    local_8->c[2] = 0.5;
                                    local_8->c[3] = 1.0;
                                    *(*local_8->W)[1] = 0.5;
                                    *(*local_8->W)[3] = -0.5;
                                    (*local_8->W)[3][2] = 1.0;
                                    *(*local_8->G)[1] = 0.5;
                                    *(*local_8->G)[2] = -0.5;
                                    (*local_8->G)[2][2] = 0.5;
                                    (*local_8->G)[3][2] = 0.5;
                                  }
                                  else {
                                    iVar1 = strcmp("ARKODE_IMEX_MRI_GARK3a",in_RDI);
                                    if (iVar1 == 0) {
                                      local_8 = MRIStepCoupling_Alloc
                                                          ((int)((ulong)in_stack_fffffffffffffdb8 >>
                                                                0x20),(int)in_stack_fffffffffffffdb8
                                                           ,type);
                                      local_8->q = 3;
                                      local_8->p = 0;
                                      local_8->c[1] = 0.435866521508459;
                                      local_8->c[2] = 0.435866521508459;
                                      local_8->c[3] = 0.7179332607542295;
                                      local_8->c[4] = 0.7179332607542295;
                                      local_8->c[5] = 1.0;
                                      local_8->c[6] = 1.0;
                                      local_8->c[7] = 1.0;
                                      *(*local_8->W)[1] = 0.435866521508459;
                                      *(*local_8->W)[3] = -0.5688715801234401;
                                      (*local_8->W)[3][2] = 0.8509383193692106;
                                      *(*local_8->W)[4] = 0.4542839446436089;
                                      (*local_8->W)[4][2] = -0.4542839446436089;
                                      *(*local_8->W)[5] = -0.4271371821005074;
                                      (*local_8->W)[5][2] = 0.1562747733103381;
                                      (*local_8->W)[5][4] = 0.5529291480359398;
                                      *(*local_8->W)[7] = 0.10585829607187965;
                                      (*local_8->W)[7][2] = 0.6555675011400702;
                                      (*local_8->W)[7][4] = -1.197292318720409;
                                      (*local_8->W)[7][6] = 0.435866521508459;
                                      *(*local_8->G)[1] = 0.435866521508459;
                                      *(*local_8->G)[2] = -0.435866521508459;
                                      (*local_8->G)[2][2] = 0.435866521508459;
                                      *(*local_8->G)[3] = -0.4103336962288525;
                                      (*local_8->G)[3][2] = 0.692400435474623;
                                      *(*local_8->G)[4] = 0.4103336962288525;
                                      (*local_8->G)[4][2] = -0.8462002177373115;
                                      (*local_8->G)[4][4] = 0.435866521508459;
                                      *(*local_8->G)[5] = 0.435866521508459;
                                      (*local_8->G)[5][2] = 0.9264299099302395;
                                      (*local_8->G)[5][4] = -1.080229692192928;
                                      *(*local_8->G)[6] = -0.435866521508459;
                                      (*local_8->G)[6][6] = 0.435866521508459;
                                    }
                                    else {
                                      iVar1 = strcmp("ARKODE_IMEX_MRI_GARK3b",in_RDI);
                                      if (iVar1 == 0) {
                                        local_8 = MRIStepCoupling_Alloc
                                                            ((int)((ulong)in_stack_fffffffffffffdb8
                                                                  >> 0x20),
                                                             (int)in_stack_fffffffffffffdb8,type);
                                        local_8->q = 3;
                                        local_8->p = 0;
                                        local_8->c[1] = 0.435866521508459;
                                        local_8->c[2] = 0.435866521508459;
                                        local_8->c[3] = 0.7179332607542295;
                                        local_8->c[4] = 0.7179332607542295;
                                        local_8->c[5] = 1.0;
                                        local_8->c[6] = 1.0;
                                        local_8->c[7] = 1.0;
                                        *(*local_8->W)[1] = 0.435866521508459;
                                        *(*local_8->W)[3] = -0.17501452855704677;
                                        (*local_8->W)[3][2] = 0.45708126780281727;
                                        *(*local_8->W)[4] = 0.06042689307721552;
                                        (*local_8->W)[4][2] = -0.06042689307721552;
                                        *(*local_8->W)[5] = 0.11952139594254545;
                                        (*local_8->W)[5][2] = -1.843725226689662;
                                        (*local_8->W)[5][4] = 2.006270569992887;
                                        *(*local_8->W)[6] = -0.5466585780430528;
                                        (*local_8->W)[6][2] = 2.0;
                                        (*local_8->W)[6][4] = -1.4533414219569472;
                                        *(*local_8->W)[7] = 0.10585829607187965;
                                        (*local_8->W)[7][2] = 0.6555675011400702;
                                        (*local_8->W)[7][4] = -1.197292318720409;
                                        (*local_8->W)[7][6] = 0.435866521508459;
                                        *(*local_8->G)[1] = 0.435866521508459;
                                        *(*local_8->G)[2] = -0.435866521508459;
                                        (*local_8->G)[2][2] = 0.435866521508459;
                                        *(*local_8->G)[3] = 0.04142737535644148;
                                        (*local_8->G)[3][2] = 0.24063936388932902;
                                        *(*local_8->G)[4] = -0.04142737535644148;
                                        (*local_8->G)[4][2] = -0.39443914615201753;
                                        (*local_8->G)[4][4] = 0.435866521508459;
                                        *(*local_8->G)[5] = 0.11233731430060478;
                                        (*local_8->G)[5][2] = 1.051807513648115;
                                        (*local_8->G)[5][4] = -0.8820780887029493;
                                        *(*local_8->G)[6] = -0.11233731430060478;
                                        (*local_8->G)[6][2] = -0.12537760371787546;
                                        (*local_8->G)[6][4] = -0.19815160348997876;
                                        (*local_8->G)[6][6] = 0.435866521508459;
                                      }
                                      else {
                                        iVar1 = strcmp("ARKODE_IMEX_MRI_GARK4",in_RDI);
                                        if (iVar1 == 0) {
                                          local_8 = MRIStepCoupling_Alloc
                                                              ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                          local_8->q = 4;
                                          local_8->p = 0;
                                          local_8->c[1] = 0.5;
                                          local_8->c[2] = 0.5;
                                          local_8->c[3] = 0.625;
                                          local_8->c[4] = 0.625;
                                          local_8->c[5] = (sunrealtype)&DAT_3fe8000000000000;
                                          local_8->c[6] = (sunrealtype)&DAT_3fe8000000000000;
                                          local_8->c[7] = 0.875;
                                          local_8->c[8] = 0.875;
                                          local_8->c[9] = 1.0;
                                          local_8->c[10] = 1.0;
                                          local_8->c[0xb] = 1.0;
                                          *(*local_8->W)[1] = 0.5;
                                          *(*local_8->W)[3] = -1.9171653436366287;
                                          (*local_8->W)[3][2] = 2.0421653436366287;
                                          *(*local_8->W)[4] = -0.40475103180110594;
                                          (*local_8->W)[4][2] = 0.40475103180110594;
                                          *(*local_8->W)[5] = 11.451466022492216;
                                          (*local_8->W)[5][2] = -30.210757475265044;
                                          (*local_8->W)[5][4] = 18.884291452772825;
                                          *(*local_8->W)[6] = -0.7090335647602615;
                                          (*local_8->W)[6][2] = 1.0303072085875187;
                                          (*local_8->W)[6][4] = -0.3212736438272573;
                                          *(*local_8->W)[7] = -29.995487164558284;
                                          (*local_8->W)[7][2] = 37.6059827749918;
                                          (*local_8->W)[7][4] = 0.3212736438272573;
                                          (*local_8->W)[7][6] = -7.806769254260774;
                                          *(*local_8->W)[8] = 3.104665054272962;
                                          (*local_8->W)[8][2] = -2.4303250197571624;
                                          (*local_8->W)[8][4] = -1.9054793011515245;
                                          (*local_8->W)[8][6] = 1.2311392666357248;
                                          *(*local_8->W)[9] = -2.4244295477520477;
                                          (*local_8->W)[9][2] = 2.4303250197571624;
                                          (*local_8->W)[9][4] = 1.9054793011515245;
                                          (*local_8->W)[9][6] = -1.2311392666357248;
                                          (*local_8->W)[9][8] = -0.5552355065209142;
                                          *(*local_8->W)[10] = -0.010441350444797486;
                                          (*local_8->W)[10][2] = 0.07260303614655074;
                                          (*local_8->W)[10][4] = -0.1288275951677261;
                                          (*local_8->W)[10][6] = 0.11293553500938236;
                                          (*local_8->W)[10][8] = -0.04626962554340952;
                                          *(*local_8->W)[0xb] = -0.8108522787762101;
                                          (*local_8->W)[0xb][2] = 0.2560073199220492;
                                          (*local_8->W)[0xb][4] = 0.8068294072697528;
                                          (*local_8->W)[0xb][6] = -0.4557148228721824;
                                          (*local_8->W)[0xb][8] = -0.04626962554340952;
                                          (*local_8->W)[0xb][10] = 0.25;
                                          *local_8->W[1][3] = 4.084330687273257;
                                          local_8->W[1][3][2] = -4.084330687273257;
                                          *local_8->W[1][5] = -21.843429981382222;
                                          local_8->W[1][5][2] = 59.61201288692787;
                                          local_8->W[1][5][4] = -37.76858290554565;
                                          *local_8->W[1][7] = 61.65904145863709;
                                          local_8->W[1][7][2] = -77.27257996715863;
                                          local_8->W[1][7][6] = 15.613538508521549;
                                          *local_8->W[1][9] = -1.1104710130418285;
                                          local_8->W[1][9][8] = 1.1104710130418285;
                                          *(*local_8->G)[1] = 0.5;
                                          *(*local_8->G)[2] = -0.25;
                                          (*local_8->G)[2][2] = 0.25;
                                          *(*local_8->G)[3] = -3.977281248108488;
                                          (*local_8->G)[3][2] = 4.102281248108488;
                                          *(*local_8->G)[4] = -0.06905388741401691;
                                          (*local_8->G)[4][2] = -0.1809461125859831;
                                          (*local_8->G)[4][4] = 0.25;
                                          *(*local_8->G)[5] = -1.7617676637579205;
                                          (*local_8->G)[5][2] = 2.6945246983772986;
                                          (*local_8->G)[5][4] = -0.8077570346193781;
                                          *(*local_8->G)[6] = 0.555872179155397;
                                          (*local_8->G)[6][2] = -0.6799140501579995;
                                          (*local_8->G)[6][4] = -0.12595812899739744;
                                          (*local_8->G)[6][6] = 0.25;
                                          *(*local_8->G)[7] = -5.840176028724956;
                                          (*local_8->G)[7][2] = 8.174456684291915;
                                          (*local_8->G)[7][4] = 0.12595812899739744;
                                          (*local_8->G)[7][6] = -2.3352387845643565;
                                          *(*local_8->G)[8] = -1.9067926451678119;
                                          (*local_8->G)[8][2] = -1.5470578113851239;
                                          (*local_8->G)[8][4] = 4.12988801314935;
                                          (*local_8->G)[8][6] = -0.9260375565964145;
                                          (*local_8->G)[8][8] = 0.25;
                                          *(*local_8->G)[9] = 3.337028151688726;
                                          (*local_8->G)[9][2] = 1.5470578113851239;
                                          (*local_8->G)[9][4] = -4.12988801314935;
                                          (*local_8->G)[9][6] = 0.9260375565964145;
                                          (*local_8->G)[9][8] = -1.5552355065209142;
                                          *(*local_8->G)[10] = -0.8212936292210076;
                                          (*local_8->G)[10][2] = 0.3286103560686;
                                          (*local_8->G)[10][4] = 0.6780018121020267;
                                          (*local_8->G)[10][6] = -0.34277928786280004;
                                          (*local_8->G)[10][8] = -0.09253925108681904;
                                          (*local_8->G)[10][10] = 0.25;
                                          *local_8->G[1][3] = 8.704562496216976;
                                          local_8->G[1][3][2] = -8.704562496216976;
                                          *local_8->G[1][5] = 3.911643102343875;
                                          local_8->G[1][5][2] = -5.027157171582631;
                                          local_8->G[1][5][4] = 1.1155140692387562;
                                          *local_8->G[1][7] = 10.818607699139118;
                                          local_8->G[1][7][2] = -14.98908526826783;
                                          local_8->G[1][7][6] = 4.170477569128713;
                                          *local_8->G[1][9] = -2.6104710130418285;
                                          local_8->G[1][9][8] = 2.6104710130418285;
                                        }
                                        else {
                                          iVar1 = strcmp("ARKODE_IMEX_MRI_SR21",in_RDI);
                                          if (iVar1 == 0) {
                                            local_8 = MRIStepCoupling_Alloc
                                                                ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                            local_8->q = 2;
                                            local_8->p = 1;
                                            local_8->c[1] = 0.6;
                                            local_8->c[2] = 0.26666666666666666;
                                            local_8->c[3] = 1.0;
                                            *(*local_8->W)[1] = 0.6;
                                            *(*local_8->W)[2] = 0.08484848484848485;
                                            (*local_8->W)[2][1] = 0.18181818181818182;
                                            *(*local_8->W)[3] = -0.24074074074074073;
                                            (*local_8->W)[3][1] = 0.5074074074074074;
                                            (*local_8->W)[3][2] = 0.7333333333333333;
                                            *(*local_8->W)[4] = -0.25;
                                            (*local_8->W)[4][1] = 0.5;
                                            (*local_8->W)[4][2] = (sunrealtype)&DAT_3fe8000000000000
                                            ;
                                            *(*local_8->G)[1] = -0.4782608695652174;
                                            (*local_8->G)[1][1] = 0.4782608695652174;
                                            *(*local_8->G)[2] = -0.12778064195833572;
                                            (*local_8->G)[2][1] = -0.3504802276068817;
                                            (*local_8->G)[2][2] = 0.4782608695652174;
                                            *(*local_8->G)[3] = 0.12817373657159245;
                                            (*local_8->G)[3][1] = -0.9496349237862043;
                                            (*local_8->G)[3][2] = 0.34320031764939446;
                                            (*local_8->G)[3][3] = 0.4782608695652174;
                                            *(*local_8->G)[4] = -2.5833333333333335;
                                            (*local_8->G)[4][1] = -0.16666666666666666;
                                            (*local_8->G)[4][2] = 2.75;
                                          }
                                          else {
                                            iVar1 = strcmp("ARKODE_IMEX_MRI_SR32",in_RDI);
                                            if (iVar1 == 0) {
                                              local_8 = MRIStepCoupling_Alloc
                                                                  ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                              local_8->q = 3;
                                              local_8->p = 2;
                                              local_8->c[1] = 0.6764705882352942;
                                              local_8->c[2] = 0.8;
                                              local_8->c[3] = 1.1333333333333333;
                                              local_8->c[4] = 1.0;
                                              *(*local_8->W)[1] = 0.6764705882352942;
                                              *(*local_8->W)[2] = 1.0142857142857142;
                                              (*local_8->W)[2][1] = -0.21428571428571427;
                                              *(*local_8->W)[3] = 0.10735930735930736;
                                              (*local_8->W)[3][1] = 0.5714285714285714;
                                              (*local_8->W)[3][2] = 0.45454545454545453;
                                              *(*local_8->W)[4] = 0.8641357630008525;
                                              (*local_8->W)[4][1] = 0.08623188405797101;
                                              (*local_8->W)[4][2] = 0.34375;
                                              (*local_8->W)[4][3] = -0.29411764705882354;
                                              *(*local_8->W)[5] = 1.0203249859689445;
                                              (*local_8->W)[5][1] = -1.4838709677419355;
                                              (*local_8->W)[5][2] = 1.9705882352941178;
                                              (*local_8->W)[5][3] = -0.5070422535211268;
                                              *local_8->W[1][2] = -0.2264473168820995;
                                              local_8->W[1][2][1] = 0.2264473168820995;
                                              *local_8->W[1][3] = -1.7415039794633156;
                                              local_8->W[1][3][1] = 8.210746794478919;
                                              local_8->W[1][3][2] = -6.469242815015602;
                                              *local_8->W[1][4] = -1.2954512170341839;
                                              local_8->W[1][4][1] = 2.560595940177763;
                                              local_8->W[1][4][2] = -2.104988533033297;
                                              local_8->W[1][4][3] = 0.8398438098897179;
                                              *local_8->W[1][5] = -1.6386815830309893;
                                              local_8->W[1][5][1] = 6.0831260274754335;
                                              local_8->W[1][5][2] = -5.777777777777778;
                                              local_8->W[1][5][3] = 1.3333333333333333;
                                              *(*local_8->G)[1] = -0.5714285714285714;
                                              (*local_8->G)[1][1] = 0.5714285714285714;
                                              *(*local_8->G)[2] = -0.8655695979919582;
                                              (*local_8->G)[2][1] = 0.2941410265633868;
                                              (*local_8->G)[2][2] = 0.5714285714285714;
                                              *(*local_8->G)[3] = 1.211752194844657;
                                              (*local_8->G)[3][1] = -2.2377262208186828;
                                              (*local_8->G)[3][2] = 0.45454545454545453;
                                              (*local_8->G)[3][3] = 0.5714285714285714;
                                              *(*local_8->G)[4] = 0.021355814748372136;
                                              (*local_8->G)[4][1] = -0.07308298152405064;
                                              (*local_8->G)[4][2] = -0.20101452403881268;
                                              (*local_8->G)[4][3] = -0.31868688061408024;
                                              (*local_8->G)[4][4] = 0.5714285714285714;
                                              *(*local_8->G)[5] = -0.043236714975845414;
                                              (*local_8->G)[5][1] = 0.05514147688060732;
                                              (*local_8->G)[5][2] = 0.07142857142857142;
                                              (*local_8->G)[5][3] = -0.08333333333333333;
                                            }
                                            else {
                                              iVar1 = strcmp("ARKODE_IMEX_MRI_SR43",in_RDI);
                                              if (iVar1 == 0) {
                                                local_8 = MRIStepCoupling_Alloc
                                                                    ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                                local_8->q = 4;
                                                local_8->p = 3;
                                                local_8->c[1] = 0.25;
                                                local_8->c[2] = (sunrealtype)&DAT_3fe8000000000000;
                                                local_8->c[3] = 0.55;
                                                local_8->c[4] = 0.5;
                                                local_8->c[5] = 1.0;
                                                local_8->c[6] = 1.0;
                                                *(*local_8->W)[1] = 0.25;
                                                *(*local_8->W)[2] = 1.125;
                                                (*local_8->W)[2][1] = -0.375;
                                                *(*local_8->W)[3] = 0.07991452991452991;
                                                (*local_8->W)[3][1] = 0.7777777777777778;
                                                (*local_8->W)[3][2] = -0.3076923076923077;
                                                *(*local_8->W)[4] = 0.3878787878787879;
                                                (*local_8->W)[4][1] = 0.16666666666666666;
                                                (*local_8->W)[4][2] = -0.6;
                                                (*local_8->W)[4][3] = 0.5454545454545454;
                                                *(*local_8->W)[5] = 3.3076249271561773;
                                                (*local_8->W)[5][1] = -0.2222222222222222;
                                                (*local_8->W)[5][2] = -0.36363636363636365;
                                                (*local_8->W)[5][3] = -0.16666666666666666;
                                                (*local_8->W)[5][4] = -1.5550996746309247;
                                                (*local_8->W)[6][1] = 0.6363636363636364;
                                                (*local_8->W)[6][2] = -8.344696969696969;
                                                (*local_8->W)[6][3] = 13.667929292929292;
                                                (*local_8->W)[6][4] = -7.083333333333333;
                                                (*local_8->W)[6][5] = 2.1237373737373737;
                                                *(*local_8->W)[7] = 0.0025;
                                                (*local_8->W)[7][1] = 4.083333333333333;
                                                (*local_8->W)[7][2] = 7.166666666666667;
                                                (*local_8->W)[7][3] = -0.7;
                                                (*local_8->W)[7][4] = -7.083333333333333;
                                                (*local_8->W)[7][5] = -2.4691666666666667;
                                                *local_8->W[1][2] = -2.75;
                                                local_8->W[1][2][1] = 2.75;
                                                *local_8->W[1][3] = -0.4198290598290598;
                                                local_8->W[1][3][1] = -0.4088888888888889;
                                                local_8->W[1][3][2] = 0.8287179487179487;
                                                *local_8->W[1][4] = -0.9169340463458111;
                                                local_8->W[1][4][1] = 0.6549019607843137;
                                                local_8->W[1][4][2] = 1.463235294117647;
                                                local_8->W[1][4][3] = -1.2012032085561497;
                                                *local_8->W[1][5] = -6.615249854312355;
                                                local_8->W[1][5][1] = 7.027777777777778;
                                                local_8->W[1][5][2] = -0.5227272727272727;
                                                local_8->W[1][5][3] = 25.333333333333332;
                                                local_8->W[1][5][4] = -25.223133984071485;
                                                local_8->W[1][6][1] = 0.8106060606060606;
                                                local_8->W[1][6][2] = 14.647727272727273;
                                                local_8->W[1][6][3] = -11.710858585858587;
                                                local_8->W[1][6][5] = -3.7474747474747474;
                                                *local_8->W[1][7] = -0.005;
                                                local_8->W[1][7][1] = -5.708333333333333;
                                                local_8->W[1][7][2] = -14.6875;
                                                local_8->W[1][7][3] = 15.4625;
                                                local_8->W[1][7][5] = 4.9383333333333335;
                                                *(*local_8->G)[1] = -0.25;
                                                (*local_8->G)[1][1] = 0.25;
                                                *(*local_8->G)[2] = 0.25;
                                                (*local_8->G)[2][1] = -0.5;
                                                (*local_8->G)[2][2] = 0.25;
                                                *(*local_8->G)[3] = 0.13;
                                                (*local_8->G)[3][1] = -0.23333333333333334;
                                                (*local_8->G)[3][2] = -0.14666666666666667;
                                                (*local_8->G)[3][3] = 0.25;
                                                *(*local_8->G)[4] = 0.07058823529411765;
                                                (*local_8->G)[4][1] = -0.2213235294117647;
                                                (*local_8->G)[4][2] = -0.18198529411764705;
                                                (*local_8->G)[4][3] = 0.08272058823529412;
                                                (*local_8->G)[4][4] = 0.25;
                                                (*local_8->G)[5][1] = -2.25;
                                                (*local_8->G)[5][2] = -0.3958333333333333;
                                                (*local_8->G)[5][3] = -4.6875;
                                                (*local_8->G)[5][4] = 7.083333333333333;
                                                (*local_8->G)[5][5] = 0.25;
                                              }
                                              else {
                                                iVar1 = strcmp("ARKODE_MERK21",in_RDI);
                                                if (iVar1 == 0) {
                                                  local_8 = MRIStepCoupling_Alloc
                                                                      ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                                  local_8->q = 2;
                                                  local_8->p = 1;
                                                  local_8->ngroup = 2;
                                                  **local_8->group = 1;
                                                  (*local_8->group)[1] = 3;
                                                  *local_8->group[1] = 2;
                                                  local_8->c[1] = 0.5;
                                                  local_8->c[2] = 1.0;
                                                  *(*local_8->W)[1] = 1.0;
                                                  *(*local_8->W)[2] = 1.0;
                                                  *(*local_8->W)[3] = 1.0;
                                                  *local_8->W[1][2] = -2.0;
                                                  local_8->W[1][2][1] = 2.0;
                                                }
                                                else {
                                                  iVar1 = strcmp("ARKODE_MERK32",in_RDI);
                                                  if (iVar1 == 0) {
                                                    local_8 = MRIStepCoupling_Alloc
                                                                        ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                                  local_8->q = 3;
                                                  local_8->p = 2;
                                                  local_8->ngroup = 3;
                                                  **local_8->group = 1;
                                                  *local_8->group[1] = 2;
                                                  local_8->group[1][1] = 4;
                                                  *local_8->group[2] = 3;
                                                  local_8->c[1] = 0.5;
                                                  local_8->c[2] = 0.6666666666666666;
                                                  local_8->c[3] = 1.0;
                                                  *(*local_8->W)[1] = 1.0;
                                                  *(*local_8->W)[2] = 1.0;
                                                  *(*local_8->W)[3] = 1.0;
                                                  *(*local_8->W)[4] = 1.0;
                                                  *local_8->W[1][2] = -2.0;
                                                  local_8->W[1][2][1] = 2.0;
                                                  *local_8->W[1][3] = -1.5;
                                                  local_8->W[1][3][2] = 1.5;
                                                  *local_8->W[1][4] = -2.0;
                                                  local_8->W[1][4][1] = 2.0;
                                                  }
                                                  else {
                                                    iVar1 = strcmp("ARKODE_MERK43",in_RDI);
                                                    if (iVar1 == 0) {
                                                      local_8 = MRIStepCoupling_Alloc
                                                                          ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                                  local_8->q = 4;
                                                  local_8->p = 3;
                                                  local_8->ngroup = 4;
                                                  **local_8->group = 1;
                                                  *local_8->group[1] = 3;
                                                  local_8->group[1][1] = 2;
                                                  *local_8->group[2] = 5;
                                                  local_8->group[2][1] = 4;
                                                  local_8->group[2][2] = 7;
                                                  *local_8->group[3] = 6;
                                                  local_8->c[1] = 0.5;
                                                  local_8->c[2] = 0.5;
                                                  local_8->c[3] = 0.3333333333333333;
                                                  local_8->c[4] = 0.8333333333333334;
                                                  local_8->c[5] = 0.3333333333333333;
                                                  local_8->c[6] = 1.0;
                                                  *(*local_8->W)[1] = 1.0;
                                                  *(*local_8->W)[2] = 1.0;
                                                  *(*local_8->W)[3] = 1.0;
                                                  *(*local_8->W)[4] = 1.0;
                                                  *(*local_8->W)[5] = 1.0;
                                                  *(*local_8->W)[6] = 1.0;
                                                  *(*local_8->W)[7] = 1.0;
                                                  *local_8->W[1][2] = -2.0;
                                                  local_8->W[1][2][1] = 2.0;
                                                  *local_8->W[1][3] = -2.0;
                                                  local_8->W[1][3][1] = 2.0;
                                                  *local_8->W[1][4] = -4.999999999999998;
                                                  local_8->W[1][4][2] = -3.9999999999999996;
                                                  local_8->W[1][4][3] = 8.999999999999998;
                                                  *local_8->W[1][5] = -4.999999999999998;
                                                  local_8->W[1][5][2] = -3.9999999999999996;
                                                  local_8->W[1][5][3] = 8.999999999999998;
                                                  *local_8->W[1][6] = -4.200000000000001;
                                                  local_8->W[1][6][4] = -0.7999999999999999;
                                                  local_8->W[1][6][5] = 5.000000000000001;
                                                  *local_8->W[1][7] = -4.999999999999998;
                                                  local_8->W[1][7][2] = -3.9999999999999996;
                                                  local_8->W[1][7][3] = 8.999999999999998;
                                                  *local_8->W[2][4] = 5.999999999999998;
                                                  local_8->W[2][4][2] = 11.999999999999998;
                                                  local_8->W[2][4][3] = -17.999999999999996;
                                                  *local_8->W[2][5] = 5.999999999999998;
                                                  local_8->W[2][5][2] = 11.999999999999998;
                                                  local_8->W[2][5][3] = -17.999999999999996;
                                                  *local_8->W[2][6] = 3.6;
                                                  local_8->W[2][6][4] = 2.4;
                                                  local_8->W[2][6][5] = -6.0;
                                                  *local_8->W[2][7] = 5.999999999999998;
                                                  local_8->W[2][7][2] = 11.999999999999998;
                                                  local_8->W[2][7][3] = -17.999999999999996;
                                                  }
                                                  else {
                                                    iVar1 = strcmp("ARKODE_MERK54",in_RDI);
                                                    if (iVar1 == 0) {
                                                      local_8 = MRIStepCoupling_Alloc
                                                                          ((int)((ulong)
                                                  in_stack_fffffffffffffdb8 >> 0x20),
                                                  (int)in_stack_fffffffffffffdb8,type);
                                                  local_8->q = 5;
                                                  local_8->p = 4;
                                                  local_8->ngroup = 5;
                                                  **local_8->group = 1;
                                                  *local_8->group[1] = 3;
                                                  local_8->group[1][1] = 2;
                                                  *local_8->group[2] = 6;
                                                  local_8->group[2][1] = 5;
                                                  local_8->group[2][2] = 4;
                                                  *local_8->group[3] = 8;
                                                  local_8->group[3][1] = 9;
                                                  local_8->group[3][2] = 7;
                                                  local_8->group[3][3] = 0xb;
                                                  *local_8->group[4] = 10;
                                                  local_8->c[1] = 0.5;
                                                  local_8->c[2] = 0.5;
                                                  local_8->c[3] = 0.3333333333333333;
                                                  local_8->c[4] = 0.5;
                                                  local_8->c[5] = 0.3333333333333333;
                                                  local_8->c[6] = 0.25;
                                                  local_8->c[7] = 0.7;
                                                  local_8->c[8] = 0.5;
                                                  local_8->c[9] = 0.6666666666666666;
                                                  local_8->c[10] = 1.0;
                                                  *(*local_8->W)[1] = 1.0;
                                                  *(*local_8->W)[2] = 1.0;
                                                  *(*local_8->W)[3] = 1.0;
                                                  *(*local_8->W)[4] = 1.0;
                                                  *(*local_8->W)[5] = 1.0;
                                                  *(*local_8->W)[6] = 1.0;
                                                  *(*local_8->W)[7] = 1.0;
                                                  *(*local_8->W)[8] = 1.0;
                                                  *(*local_8->W)[9] = 1.0;
                                                  *(*local_8->W)[10] = 1.0;
                                                  *(*local_8->W)[0xb] = 1.0;
                                                  *local_8->W[1][2] = -2.0;
                                                  local_8->W[1][2][1] = 2.0;
                                                  *local_8->W[1][3] = -2.0;
                                                  local_8->W[1][3][1] = 2.0;
                                                  *local_8->W[1][4] = -4.999999999999998;
                                                  local_8->W[1][4][2] = -3.9999999999999996;
                                                  local_8->W[1][4][3] = 8.999999999999998;
                                                  *local_8->W[1][5] = -4.999999999999998;
                                                  local_8->W[1][5][2] = -3.9999999999999996;
                                                  local_8->W[1][5][3] = 8.999999999999998;
                                                  *local_8->W[1][6] = -4.999999999999998;
                                                  local_8->W[1][6][2] = -3.9999999999999996;
                                                  local_8->W[1][6][3] = 8.999999999999998;
                                                  *local_8->W[1][7] = -9.000000000000007;
                                                  local_8->W[1][7][4] = 3.9999999999999996;
                                                  local_8->W[1][7][5] = -27.0;
                                                  local_8->W[1][7][6] = 32.00000000000001;
                                                  *local_8->W[1][8] = -9.000000000000007;
                                                  local_8->W[1][8][4] = 3.9999999999999996;
                                                  local_8->W[1][8][5] = -27.0;
                                                  local_8->W[1][8][6] = 32.00000000000001;
                                                  *local_8->W[1][9] = -9.000000000000007;
                                                  local_8->W[1][9][4] = 3.9999999999999996;
                                                  local_8->W[1][9][5] = -27.0;
                                                  local_8->W[1][9][6] = 32.00000000000001;
                                                  *local_8->W[1][10] = -4.928571428571431;
                                                  local_8->W[1][10][7] = 71.42857142857147;
                                                  local_8->W[1][10][8] = 28.000000000000007;
                                                  local_8->W[1][10][9] = -94.50000000000004;
                                                  *local_8->W[1][0xb] = -9.000000000000007;
                                                  local_8->W[1][0xb][4] = 3.9999999999999996;
                                                  local_8->W[1][0xb][5] = -27.0;
                                                  local_8->W[1][0xb][6] = 32.00000000000001;
                                                  *local_8->W[2][4] = 5.999999999999998;
                                                  local_8->W[2][4][2] = 11.999999999999998;
                                                  local_8->W[2][4][3] = -17.999999999999996;
                                                  *local_8->W[2][5] = 5.999999999999998;
                                                  local_8->W[2][5][2] = 11.999999999999998;
                                                  local_8->W[2][5][3] = -17.999999999999996;
                                                  *local_8->W[2][6] = 5.999999999999998;
                                                  local_8->W[2][6][2] = 11.999999999999998;
                                                  local_8->W[2][6][3] = -17.999999999999996;
                                                  *local_8->W[2][7] = 26.0;
                                                  local_8->W[2][7][4] = -27.999999999999993;
                                                  local_8->W[2][7][5] = 162.00000000000003;
                                                  local_8->W[2][7][6] = -160.00000000000003;
                                                  *local_8->W[2][8] = 26.0;
                                                  local_8->W[2][8][4] = -27.999999999999993;
                                                  local_8->W[2][8][5] = 162.00000000000003;
                                                  local_8->W[2][8][6] = -160.00000000000003;
                                                  *local_8->W[2][9] = 26.0;
                                                  local_8->W[2][9][4] = -27.999999999999993;
                                                  local_8->W[2][9][5] = 162.00000000000003;
                                                  local_8->W[2][9][6] = -160.00000000000003;
                                                  *local_8->W[2][10] = 7.999999999999943;
                                                  local_8->W[2][10][7] = -250.00000000000009;
                                                  local_8->W[2][10][8] = -82.00000000000004;
                                                  local_8->W[2][10][9] = 324.00000000000017;
                                                  *local_8->W[2][0xb] = 26.0;
                                                  local_8->W[2][0xb][4] = -27.999999999999993;
                                                  local_8->W[2][0xb][5] = 162.00000000000003;
                                                  local_8->W[2][0xb][6] = -160.00000000000003;
                                                  *local_8->W[3][7] = -24.000000000000057;
                                                  local_8->W[3][7][4] = 47.99999999999999;
                                                  local_8->W[3][7][5] = -216.0;
                                                  local_8->W[3][7][6] = 192.00000000000006;
                                                  *local_8->W[3][8] = -24.000000000000057;
                                                  local_8->W[3][8][4] = 47.99999999999999;
                                                  local_8->W[3][8][5] = -216.0;
                                                  local_8->W[3][8][6] = 192.00000000000006;
                                                  *local_8->W[3][9] = -24.000000000000057;
                                                  local_8->W[3][9][4] = 47.99999999999999;
                                                  local_8->W[3][9][5] = -216.0;
                                                  local_8->W[3][9][6] = 192.00000000000006;
                                                  *local_8->W[3][10] = -4.285714285714278;
                                                  local_8->W[3][10][7] = 214.2857142857144;
                                                  local_8->W[3][10][8] = 60.00000000000002;
                                                  local_8->W[3][10][9] = -270.0000000000001;
                                                  *local_8->W[3][0xb] = -24.000000000000057;
                                                  local_8->W[3][0xb][4] = 47.99999999999999;
                                                  local_8->W[3][0xb][5] = -216.0;
                                                  local_8->W[3][0xb][6] = 192.00000000000006;
                                                  }
                                                  else {
                                                    arkProcessError((ARKodeMem)0x0,-0x16,0x3f,
                                                                                                                                        
                                                  "MRIStepCoupling_LoadTableByName",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mri_tables.c"
                                                  ,"Unknown coupling table");
                                                  local_8 = (MRIStepCoupling)0x0;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_LoadTableByName(const char* method)
{
#define ARK_MRI_TABLE(name, coeff) \
  if (strcmp(#name, method) == 0) coeff
#include "arkode_mri_tables.def"
#undef ARK_MRI_TABLE

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown coupling table");

  return NULL;
}